

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ArrayWithPreallocation.h
# Opt level: O0

void __thiscall
soul::ArrayWithPreallocation<soul::pool_ref<soul::heart::Variable>,_4UL>::clear
          (ArrayWithPreallocation<soul::pool_ref<soul::heart::Variable>,_4UL> *this)

{
  ulong local_18;
  size_t i;
  ArrayWithPreallocation<soul::pool_ref<soul::heart::Variable>,_4UL> *this_local;
  
  for (local_18 = 0; local_18 < this->numActive; local_18 = local_18 + 1) {
    pool_ref<soul::heart::Variable>::~pool_ref(this->items + local_18);
  }
  this->numActive = 0;
  freeIfHeapAllocated(this);
  return;
}

Assistant:

void clear() noexcept
    {
        for (size_t i = 0; i < numActive; ++i)
            items[i].~Item();

        numActive = 0;
        freeIfHeapAllocated();
    }